

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scattering.cpp
# Opt level: O0

Float pbrt::FresnelMoment2(Float eta)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  Float r_eta3;
  Float r_eta2;
  Float r_eta;
  Float eta5;
  Float eta4;
  Float eta3;
  Float eta2;
  Float eta_local;
  undefined4 local_4;
  
  fVar1 = eta * eta;
  fVar2 = fVar1 * eta;
  fVar3 = fVar2 * eta;
  if (1.0 <= eta) {
    fVar4 = 1.0 / eta;
    local_4 = ((((((fVar4 * fVar4 * fVar4 * 45.3087 + -547.033) - fVar4 * fVar4 * 218.725) +
                  fVar4 * 458.843 + eta * 404.557) - fVar1 * 189.519) + fVar2 * 54.9327) -
              fVar3 * 9.00603) + fVar3 * eta * 0.63942;
  }
  else {
    local_4 = (((0.27614 - eta * 0.8735) + fVar1 * 1.12077) - fVar2 * 0.65095) + fVar3 * 0.07883 +
              fVar3 * eta * 0.0486;
  }
  return local_4;
}

Assistant:

Float FresnelMoment2(Float eta) {
    Float eta2 = eta * eta, eta3 = eta2 * eta, eta4 = eta3 * eta, eta5 = eta4 * eta;
    if (eta < 1) {
        return 0.27614f - 0.87350f * eta + 1.12077f * eta2 - 0.65095f * eta3 +
               0.07883f * eta4 + 0.04860f * eta5;
    } else {
        Float r_eta = 1 / eta, r_eta2 = r_eta * r_eta, r_eta3 = r_eta2 * r_eta;
        return -547.033f + 45.3087f * r_eta3 - 218.725f * r_eta2 + 458.843f * r_eta +
               404.557f * eta - 189.519f * eta2 + 54.9327f * eta3 - 9.00603f * eta4 +
               0.63942f * eta5;
    }
}